

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O1

void __thiscall cmCTestSVN::LogParser::StartElement(LogParser *this,string *name,char **atts)

{
  pointer pcVar1;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  undefined1 local_138 [8];
  char *local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  _Alloc_hider local_118;
  size_type local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  _Alloc_hider local_f8;
  size_type local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  _Alloc_hider local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  _Alloc_hider local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Alloc_hider local_98;
  size_type local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  SVNInfo *local_38;
  
  pcVar1 = (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish != pcVar1) {
    (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar1;
  }
  iVar3 = std::__cxx11::string::compare((char *)name);
  if (iVar3 == 0) {
    memset(local_138,0,0x108);
    local_138 = (undefined1  [8])&local_128;
    local_130 = (char *)0x0;
    local_128._M_allocated_capacity = local_128._M_allocated_capacity & 0xffffffffffffff00;
    local_118._M_p = (pointer)&local_108;
    local_110 = 0;
    local_108._M_local_buf[0] = '\0';
    local_f8._M_p = (pointer)&local_e8;
    local_f0 = 0;
    local_e8._M_local_buf[0] = '\0';
    local_d8._M_p = (pointer)&local_c8;
    local_d0 = 0;
    local_c8._M_local_buf[0] = '\0';
    local_b8._M_p = (pointer)&local_a8;
    local_b0 = 0;
    local_a8._M_local_buf[0] = '\0';
    local_98._M_p = (pointer)&local_88;
    local_90 = 0;
    local_88._M_local_buf[0] = '\0';
    local_78._M_p = (pointer)&local_68;
    local_70 = 0;
    local_68._M_local_buf[0] = '\0';
    local_58._M_p = (pointer)&local_48;
    local_50 = 0;
    local_48._M_local_buf[0] = '\0';
    std::__cxx11::string::operator=((string *)&this->Rev,(string *)local_138);
    std::__cxx11::string::operator=((string *)&(this->Rev).super_Revision.Date,(string *)&local_118)
    ;
    std::__cxx11::string::operator=
              ((string *)&(this->Rev).super_Revision.Author,(string *)&local_f8);
    std::__cxx11::string::operator=((string *)&(this->Rev).super_Revision.EMail,(string *)&local_d8)
    ;
    std::__cxx11::string::operator=
              ((string *)&(this->Rev).super_Revision.Committer,(string *)&local_b8);
    std::__cxx11::string::operator=
              ((string *)&(this->Rev).super_Revision.CommitterEMail,(string *)&local_98);
    std::__cxx11::string::operator=
              ((string *)&(this->Rev).super_Revision.CommitDate,(string *)&local_78);
    std::__cxx11::string::operator=((string *)&(this->Rev).super_Revision.Log,(string *)&local_58);
    (this->Rev).SVNInfo = local_38;
    cmCTestVC::Revision::~Revision((Revision *)local_138);
    (this->Rev).SVNInfo = this->SVNRepo;
    pcVar4 = cmXMLParser::FindAttribute(atts,"revision");
    if (pcVar4 != (char *)0x0) {
      pcVar2 = (char *)(this->Rev).super_Revision.Rev._M_string_length;
      strlen(pcVar4);
      std::__cxx11::string::_M_replace((ulong)&this->Rev,0,pcVar2,(ulong)pcVar4);
    }
    std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::_M_erase_at_end
              (&this->Changes,
               (this->Changes).
               super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)name);
    if (iVar3 == 0) {
      local_138[0] = 0x3f;
      local_128._M_allocated_capacity = 0;
      local_128._M_local_buf[8] = '\0';
      (this->CurChange).Action = '?';
      local_130 = local_128._M_local_buf + 8;
      std::__cxx11::string::operator=((string *)&(this->CurChange).Path,(string *)&local_130);
      if (local_130 != local_128._M_local_buf + 8) {
        operator_delete(local_130,CONCAT71(local_128._9_7_,local_128._M_local_buf[8]) + 1);
      }
      pcVar4 = cmXMLParser::FindAttribute(atts,"action");
      if (pcVar4 != (char *)0x0) {
        (this->CurChange).Action = *pcVar4;
      }
    }
  }
  return;
}

Assistant:

void StartElement(const std::string& name, const char** atts) override
  {
    this->CData.clear();
    if (name == "logentry") {
      this->Rev = Revision();
      this->Rev.SVNInfo = &SVNRepo;
      if (const char* rev =
            cmCTestSVN::LogParser::FindAttribute(atts, "revision")) {
        this->Rev.Rev = rev;
      }
      this->Changes.clear();
    } else if (name == "path") {
      this->CurChange = Change();
      if (const char* action =
            cmCTestSVN::LogParser::FindAttribute(atts, "action")) {
        this->CurChange.Action = action[0];
      }
    }
  }